

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_info.h
# Opt level: O1

void __thiscall pybind11::buffer_info::buffer_info(buffer_info *this,Py_buffer *view,bool ownview)

{
  long *__first;
  void *pvVar1;
  long lVar2;
  size_type __n;
  void *ptr;
  allocator_type local_eb;
  allocator<char> local_ea;
  allocator_type local_e9;
  vector<long,_std::allocator<long>_> strides;
  void *local_c0;
  void *local_b8;
  long local_b0;
  void *local_a8;
  buffer_info *local_a0;
  long local_98;
  Py_ssize_t local_90;
  any_container<long> local_88;
  any_container<long> local_70;
  string local_58;
  Py_ssize_t local_38;
  
  ptr = view->buf;
  local_90 = view->itemsize;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,view->format,&local_ea);
  local_98 = (long)view->ndim;
  std::vector<long,std::allocator<long>>::vector<long*,void>
            ((vector<long,std::allocator<long>> *)&local_88,view->shape,view->shape + local_98,
             (allocator_type *)&strides);
  __first = view->strides;
  if (__first == (long *)0x0) {
    local_a8 = ptr;
    local_a0 = this;
    std::vector<long,std::allocator<long>>::vector<long*,void>
              ((vector<long,std::allocator<long>> *)&local_c0,view->shape,view->shape + view->ndim,
               &local_eb);
    pvVar1 = local_c0;
    local_38 = view->itemsize;
    lVar2 = (long)local_b8 - (long)local_c0;
    __n = lVar2 >> 3;
    std::vector<long,_std::allocator<long>_>::vector(&strides,__n,&local_38,&local_e9);
    ptr = local_a8;
    this = local_a0;
    if ((local_b8 != pvVar1) && (__n != 1)) {
      lVar2 = *(long *)((long)strides.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar2 + -8);
      do {
        lVar2 = lVar2 * *(long *)((long)local_c0 + __n * 8 + -8);
        strides.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start[__n - 2] = lVar2;
        __n = __n - 1;
      } while (__n != 1);
    }
  }
  else {
    std::vector<long,std::allocator<long>>::vector<long*,void>
              ((vector<long,std::allocator<long>> *)&strides,__first,__first + view->ndim,
               (allocator_type *)&local_c0);
  }
  local_70.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = strides.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
             ._M_start;
  local_70.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = strides.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_70.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       strides.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  strides.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  strides.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  strides.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  buffer_info(this,ptr,local_90,&local_58,local_98,&local_88,&local_70,view->readonly != 0);
  if (local_70.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (strides.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(strides.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)strides.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)strides.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((__first == (long *)0x0) && (local_c0 != (void *)0x0)) {
    operator_delete(local_c0,local_b0 - (long)local_c0);
  }
  if (local_88.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  this->m_view = view;
  this->ownview = ownview;
  return;
}

Assistant:

explicit buffer_info(Py_buffer *view, bool ownview = true)
    : buffer_info(view->buf, view->itemsize, view->format, view->ndim,
            {view->shape, view->shape + view->ndim},
            /* Though buffer::request() requests PyBUF_STRIDES, ctypes objects
             * ignore this flag and return a view with NULL strides.
             * When strides are NULL, build them manually.  */
            view->strides
            ? std::vector<ssize_t>(view->strides, view->strides + view->ndim)
            : detail::c_strides({view->shape, view->shape + view->ndim}, view->itemsize),
            view->readonly) {
        this->m_view = view;
        this->ownview = ownview;
    }